

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.h
# Opt level: O0

void __thiscall basisu::etc_block::get_block_colors_etc1s(etc_block *this,color_rgba *pBlock_colors)

{
  byte bVar1;
  uint32_t uVar2;
  uint sg;
  uint sr;
  int *piVar3;
  color_rgba *this_00;
  long lVar4;
  long in_RSI;
  undefined8 in_RDI;
  int *pInten_table;
  color_rgba b;
  etc_block *in_stack_ffffffffffffffa0;
  long lVar5;
  etc_block *in_stack_ffffffffffffffb0;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_14;
  long local_10;
  
  local_10 = in_RSI;
  color_rgba::color_rgba((color_rgba *)&local_14.field_1);
  get_base5_color(in_stack_ffffffffffffffb0);
  unpack_color5((color_rgba *)in_stack_ffffffffffffffa0,(uint16_t)((ulong)in_RDI >> 0x30),
                SUB81((ulong)in_RDI >> 0x28,0));
  uVar2 = get_inten_table(in_stack_ffffffffffffffa0,(uint32_t)((ulong)in_RDI >> 0x20));
  lVar4 = (ulong)uVar2 * 0x10;
  piVar3 = (int *)(g_etc1_inten_tables + lVar4);
  lVar5 = local_10;
  bVar1 = clamp255((uint)local_14.m_comps[0] + *piVar3);
  sg = (uint)bVar1;
  bVar1 = clamp255((uint)local_14.m_comps[1] + *piVar3);
  sr = (uint)bVar1;
  clamp255((uint)local_14.m_comps[2] + *piVar3);
  color_rgba::set((color_rgba *)in_stack_ffffffffffffffb0,sr,sg,(int)((ulong)lVar5 >> 0x20),
                  (int)lVar5);
  this_00 = (color_rgba *)(local_10 + 4);
  clamp255((uint)local_14.m_comps[0] + *(int *)(g_etc1_inten_tables + lVar4 + 4));
  clamp255((uint)local_14.m_comps[1] + *(int *)(g_etc1_inten_tables + lVar4 + 4));
  clamp255((uint)local_14.m_comps[2] + *(int *)(g_etc1_inten_tables + lVar4 + 4));
  color_rgba::set(this_00,sr,sg,(int)((ulong)lVar5 >> 0x20),(int)lVar5);
  clamp255((uint)local_14.m_comps[0] + *(int *)(g_etc1_inten_tables + lVar4 + 8));
  clamp255((uint)local_14.m_comps[1] + *(int *)(g_etc1_inten_tables + lVar4 + 8));
  clamp255((uint)local_14.m_comps[2] + *(int *)(g_etc1_inten_tables + lVar4 + 8));
  color_rgba::set(this_00,sr,sg,(int)((ulong)lVar5 >> 0x20),(int)lVar5);
  clamp255((uint)local_14.m_comps[0] + *(int *)(g_etc1_inten_tables + lVar4 + 0xc));
  clamp255((uint)local_14.m_comps[1] + *(int *)(g_etc1_inten_tables + lVar4 + 0xc));
  clamp255((uint)local_14.m_comps[2] + *(int *)(g_etc1_inten_tables + lVar4 + 0xc));
  color_rgba::set(this_00,sr,sg,(int)((ulong)lVar5 >> 0x20),(int)lVar5);
  return;
}

Assistant:

void get_block_colors_etc1s(color_rgba* pBlock_colors) const
		{
			color_rgba b;

			unpack_color5(b, get_base5_color(), true);

			const int* pInten_table = g_etc1_inten_tables[get_inten_table(0)];

			pBlock_colors[0].set(clamp255(b.r + pInten_table[0]), clamp255(b.g + pInten_table[0]), clamp255(b.b + pInten_table[0]), 255);
			pBlock_colors[1].set(clamp255(b.r + pInten_table[1]), clamp255(b.g + pInten_table[1]), clamp255(b.b + pInten_table[1]), 255);
			pBlock_colors[2].set(clamp255(b.r + pInten_table[2]), clamp255(b.g + pInten_table[2]), clamp255(b.b + pInten_table[2]), 255);
			pBlock_colors[3].set(clamp255(b.r + pInten_table[3]), clamp255(b.g + pInten_table[3]), clamp255(b.b + pInten_table[3]), 255);
		}